

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O2

ParseTokenKind __thiscall
TTD::TextFormatReader::ScanWellKnownToken
          (TextFormatReader *this,
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *charList)

{
  bool bVar1;
  ulong in_RAX;
  undefined8 uStack_28;
  char16 c;
  
  uStack_28 = in_RAX & 0xffffffffffff;
  while( true ) {
    bVar1 = FileReader::ReadRawChar(&this->super_FileReader,(char16 *)((long)&uStack_28 + 6));
    if (!bVar1) {
      return Error;
    }
    if (uStack_28._6_2_ == 0) break;
    if (uStack_28._6_2_ == 0x7e) {
      return WellKnownToken;
    }
    JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (charList,(char16 *)((long)&uStack_28 + 6));
  }
  return (uint)uStack_28._6_2_;
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::ScanWellKnownToken(JsUtil::List<char16, HeapAllocator>& charList)
    {
        char16 c = _u('\0');
        bool endFound = false;

        while(this->ReadRawChar(&c))
        {
            if(c == 0)
            {
                return NSTokens::ParseTokenKind::Error;
            }

            if(c == _u('~'))
            {
                //end of the string
                endFound = true;
                break;
            }
            else
            {
                charList.Add(c);
            }
        }

        if(!endFound)
        {
            // no ending found
            return NSTokens::ParseTokenKind::Error;
        }

        return NSTokens::ParseTokenKind::WellKnownToken;
    }